

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void __thiscall Helper::GenerateShuffleVectors(Helper *this,int n_p,int n_d,int count)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  pointer pbVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long local_368;
  ofstream output_file;
  ios_base local_270 [264];
  _Alloc_hider local_168;
  time_t t;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  allocator_type local_31;
  
  std::ofstream::ofstream((string *)&local_368);
  local_168._M_p = &stack0xfffffffffffffea8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe98,"../randoms/alice/U_PA.txt","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"../randoms/bob/U_PB.txt","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"../randoms/alice/R_PA.txt","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"../randoms/bob/R_PB.txt","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"../randoms/alice/U_DA.txt","")
  ;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"../randoms/bob/U_DB.txt","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"../randoms/alice/R_DA.txt","")
  ;
  plVar9 = local_78;
  local_88[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"../randoms/bob/R_DB.txt","");
  __l._M_len = 8;
  __l._M_array = (iterator)&stack0xfffffffffffffe98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68,__l,&local_31);
  lVar11 = -0x100;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  tVar5 = time((time_t *)&stack0xfffffffffffffe98);
  srand((uint)tVar5);
  pbVar10 = (pointer)0x0;
  do {
    std::ofstream::open((string *)&local_368,(int)((long)pbVar10 << 5) + local_68._0_4_);
    iVar1 = n_d;
    if (pbVar10 < (pointer)0x4) {
      iVar1 = n_p;
    }
    iVar3 = (uint)(pbVar10 < (pointer)0x4) * 3 + 2;
    iVar7 = count;
    file_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar10;
    while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
      cVar2 = (char)(string *)&local_368;
      if (0 < iVar1) {
        iVar8 = 0;
        iVar12 = iVar3;
        do {
          do {
            iVar4 = rand();
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_368,iVar4 % 10000);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          std::ios::widen((char)*(undefined8 *)(local_368 + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          iVar8 = iVar8 + 1;
          iVar12 = iVar3;
        } while (iVar8 != iVar1);
      }
      std::ios::widen((char)*(undefined8 *)(local_368 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    std::ostream::flush();
    std::ofstream::close();
    pbVar10 = (pointer)((long)&((file_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                               _M_p + 1);
  } while (pbVar10 != (pointer)0x8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  local_368 = _VTT;
  *(undefined8 *)((long)&local_368 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&output_file);
  std::ios_base::~ios_base(local_270);
  return;
}

Assistant:

void Helper::GenerateShuffleVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::vector<std::string> file_name = {"../randoms/alice/U_PA.txt", "../randoms/bob/U_PB.txt", "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt",
                                          "../randoms/alice/U_DA.txt", "../randoms/bob/U_DB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    time_t t;
    srand((unsigned)time(&t));

    for (int i = 0; i < 8; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 4 ? n_p : n_d);
        int m = (i < 4 ? 5 : 2);
        int l = count;
        while (l--)
        {
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    output_file << rand() %10000 << " ";
                output_file << std::endl;
            }
            output_file << std::endl;
        }
        output_file.flush();
        output_file.close();
    }
}